

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

int __thiscall hta::storage::file::Directory::open(Directory *this,char *__file,int __oflag,...)

{
  undefined8 this_00;
  logic_error *this_01;
  int in_ECX;
  path local_99;
  path path;
  
  this_00 = (long)&local_99._M_pathname._M_dataplus._M_p + 1;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)this_00,___oflag,auto_format);
  Catch::clara::std::filesystem::__cxx11::operator/
            ((path *)&path,(path *)(__file + 8),(path *)this_00);
  Catch::clara::std::filesystem::__cxx11::path::~path
            ((path *)((long)&local_99._M_pathname._M_dataplus._M_p + 1));
  std::filesystem::create_directory(&path);
  if (in_ECX == 2) {
    std::
    make_unique<hta::storage::file::Metric,hta::storage::file::FileOpenTag::ReadWrite,std::filesystem::__cxx11::path&,hta::Meta&>
              ((ReadWrite *)((long)&local_99._M_pathname._M_dataplus._M_p + 1),&local_99,
               (Meta *)&path);
  }
  else if (in_ECX == 1) {
    std::
    make_unique<hta::storage::file::Metric,hta::storage::file::FileOpenTag::Write,std::filesystem::__cxx11::path&,hta::Meta&>
              ((Write *)((long)&local_99._M_pathname._M_dataplus._M_p + 1),&local_99,(Meta *)&path);
  }
  else {
    if (in_ECX != 0) {
      this_01 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_01,"unknown OpenMode");
      __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::
    make_unique<hta::storage::file::Metric,hta::storage::file::FileOpenTag::Read,std::filesystem::__cxx11::path&>
              ((Read *)((long)&local_99._M_pathname._M_dataplus._M_p + 1),&local_99);
  }
  (this->super_Directory)._vptr_Directory = (_func_int **)local_99._M_pathname._1_8_;
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&path);
  return (int)this;
}

Assistant:

std::unique_ptr<storage::Metric> Directory::open(const std::string& name, Mode mode, Meta meta)
{
    auto path = directory_ / std::filesystem::path(name);
    // Don't do that in the metric itself (member initialization before constructor body)
    try
    {
        // We do not recursively create the directory
        // to avoid creating fresh databases in unmounted filesystems
        std::filesystem::create_directory(path);
    }
    catch (const std::filesystem::filesystem_error& e)
    {
        throw_exception(
            "Failed to create metric directory. Make sure the parent directory exists. ", path,
            ": ", e.what());
    }
    switch (mode)
    {
    case Mode::read:
        return std::make_unique<Metric>(FileOpenTag::Read(), path);
    case Mode::write:
        return std::make_unique<Metric>(FileOpenTag::Write(), path, meta);
    case Mode::read_write:
        return std::make_unique<Metric>(FileOpenTag::ReadWrite(), path, meta);
    default:
        throw std::logic_error("unknown OpenMode");
    }
}